

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> __thiscall
kj::heap<kj::(anonymous_namespace)::MultipleDerivedDynamic,int,int,bool&>
          (kj *this,int *params,int *params_1,bool *params_2)

{
  int j;
  int k;
  MultipleDerivedDynamic *this_00;
  int *piVar1;
  bool *destructorCalled;
  MultipleDerivedDynamic *extraout_RDX;
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> OVar2;
  bool *params_local_2;
  int *params_local_1;
  int *params_local;
  
  this_00 = (MultipleDerivedDynamic *)operator_new(0x28);
  piVar1 = fwd<int>(params);
  j = *piVar1;
  piVar1 = fwd<int>(params_1);
  k = *piVar1;
  destructorCalled = fwd<bool&>(params_2);
  anon_unknown_0::MultipleDerivedDynamic::MultipleDerivedDynamic(this_00,j,k,destructorCalled);
  Own<kj::(anonymous_namespace)::MultipleDerivedDynamic>::Own
            ((Own<kj::(anonymous_namespace)::MultipleDerivedDynamic> *)this,this_00,
             (Disposer *)
             &_::HeapDisposer<kj::(anonymous_namespace)::MultipleDerivedDynamic>::instance);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}